

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_private.c
# Opt level: O1

void nhr_request_close(nhr_request r)

{
  if (r->socket != -1) {
    close(r->socket);
    r->socket = -1;
  }
  return;
}

Assistant:

void nhr_request_close(nhr_request r) {
	if (r->socket != NHR_INVALID_SOCKET) {
		NHR_SOCK_CLOSE(r->socket);
		r->socket = NHR_INVALID_SOCKET;
#if defined(NHR_OS_WINDOWS)
		WSACleanup();
#endif
	}
}